

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

void __thiscall
Rml::Property::Property<Rml::TransitionList>
          (Property *this,TransitionList *value,Unit unit,int specificity)

{
  int specificity_local;
  Unit unit_local;
  TransitionList *value_local;
  Property *this_local;
  
  Variant::Variant<Rml::TransitionList&,void>(&this->value,value);
  this->unit = unit;
  this->specificity = specificity;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  ::std::shared_ptr<const_Rml::PropertySource>::shared_ptr(&this->source);
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property(PropertyType value, Unit unit, int specificity = -1) : value(value), unit(unit), specificity(specificity)
	{
		definition = nullptr;
		parser_index = -1;
	}